

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O1

void Abc_NtkSopTranspose(char *pSop,int nVars,Vec_Ptr_t *vCubes,Vec_Str_t *vStore)

{
  char cVar1;
  uint uVar2;
  void **ppvVar3;
  char *pcVar4;
  ulong uVar5;
  size_t sVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong local_40;
  
  local_40 = (ulong)(uint)nVars;
  vCubes->nSize = 0;
  if (*pSop != '\0') {
    do {
      uVar2 = vCubes->nCap;
      if (vCubes->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vCubes->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(vCubes->pArray,0x80);
          }
          vCubes->pArray = ppvVar3;
          iVar8 = 0x10;
        }
        else {
          iVar8 = uVar2 * 2;
          if (iVar8 <= (int)uVar2) goto LAB_00841c3a;
          if (vCubes->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(vCubes->pArray,(ulong)uVar2 << 4);
          }
          vCubes->pArray = ppvVar3;
        }
        vCubes->nCap = iVar8;
      }
LAB_00841c3a:
      iVar8 = vCubes->nSize;
      vCubes->nSize = iVar8 + 1;
      vCubes->pArray[iVar8] = pSop;
      pcVar4 = pSop + (nVars + 3);
      pSop = pSop + (nVars + 3);
    } while (*pcVar4 != '\0');
  }
  vStore->nSize = 0;
  if (0 < nVars) {
    uVar5 = 0;
    do {
      if (0 < vCubes->nSize) {
        lVar9 = 0;
        do {
          cVar1 = *(char *)((long)vCubes->pArray[lVar9] + uVar5);
          uVar2 = vStore->nCap;
          if (vStore->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (vStore->pArray == (char *)0x0) {
                pcVar4 = (char *)malloc(0x10);
              }
              else {
                pcVar4 = (char *)realloc(vStore->pArray,0x10);
              }
              vStore->pArray = pcVar4;
              sVar6 = 0x10;
            }
            else {
              sVar6 = (ulong)uVar2 * 2;
              if ((int)sVar6 <= (int)uVar2) goto LAB_00841cfa;
              if (vStore->pArray == (char *)0x0) {
                pcVar4 = (char *)malloc(sVar6);
              }
              else {
                pcVar4 = (char *)realloc(vStore->pArray,sVar6);
              }
              vStore->pArray = pcVar4;
            }
            vStore->nCap = (int)sVar6;
          }
LAB_00841cfa:
          iVar8 = vStore->nSize;
          vStore->nSize = iVar8 + 1;
          vStore->pArray[iVar8] = cVar1;
          lVar9 = lVar9 + 1;
        } while (lVar9 < vCubes->nSize);
      }
      uVar2 = vStore->nCap;
      if (vStore->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStore->pArray == (char *)0x0) {
            pcVar4 = (char *)malloc(0x10);
          }
          else {
            pcVar4 = (char *)realloc(vStore->pArray,0x10);
          }
          vStore->pArray = pcVar4;
          sVar6 = 0x10;
        }
        else {
          sVar6 = (ulong)uVar2 * 2;
          if ((int)sVar6 <= (int)uVar2) goto LAB_00841d83;
          if (vStore->pArray == (char *)0x0) {
            pcVar4 = (char *)malloc(sVar6);
          }
          else {
            pcVar4 = (char *)realloc(vStore->pArray,sVar6);
          }
          vStore->pArray = pcVar4;
        }
        vStore->nCap = (int)sVar6;
      }
LAB_00841d83:
      iVar8 = vStore->nSize;
      vStore->nSize = iVar8 + 1;
      vStore->pArray[iVar8] = '\0';
      uVar5 = uVar5 + 1;
    } while (uVar5 != local_40);
  }
  iVar8 = vCubes->nSize;
  vCubes->nSize = 0;
  if (0 < nVars) {
    lVar9 = 0;
    do {
      if ((lVar9 < 0) || (vStore->nSize <= lVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
      }
      pcVar4 = vStore->pArray;
      uVar2 = vCubes->nCap;
      if (vCubes->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vCubes->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(vCubes->pArray,0x80);
          }
          vCubes->pArray = ppvVar3;
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar2 * 2;
          if (iVar7 <= (int)uVar2) goto LAB_00841e48;
          if (vCubes->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(vCubes->pArray,(ulong)uVar2 << 4);
          }
          vCubes->pArray = ppvVar3;
        }
        vCubes->nCap = iVar7;
      }
LAB_00841e48:
      iVar7 = vCubes->nSize;
      vCubes->nSize = iVar7 + 1;
      vCubes->pArray[iVar7] = pcVar4 + lVar9;
      lVar9 = lVar9 + (long)iVar8 + 1;
      local_40 = local_40 - 1;
    } while (local_40 != 0);
  }
  return;
}

Assistant:

void Abc_NtkSopTranspose( char * pSop, int nVars, Vec_Ptr_t * vCubes, Vec_Str_t * vStore )
{
    char * pCube; 
    int nCubes, v, c;
    // collect original cubes
    Vec_PtrClear( vCubes );
    Abc_SopForEachCube( pSop, nVars, pCube )
        Vec_PtrPush( vCubes, pCube );
    // rebuild the cubes
    Vec_StrClear( vStore );
    for ( v = 0; v < nVars; v++ )
    {
        Vec_PtrForEachEntry( char *, vCubes, pCube, c )
            Vec_StrPush( vStore, pCube[v] );
        Vec_StrPush( vStore, '\0' );
    }
    // get the cubes
    nCubes = Vec_PtrSize( vCubes );
    Vec_PtrClear( vCubes );
    for ( v = 0; v < nVars; v++ )
        Vec_PtrPush( vCubes, Vec_StrEntryP(vStore, v*(nCubes+1)) );
}